

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void burstsort_superalphabet_bagwell(uchar **strings,size_t n)

{
  TrieNode<unsigned_short> *root;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  
  root = (TrieNode<unsigned_short> *)operator_new(0x82000);
  memset(root,0,0x82000);
  insert<32000u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_short>,unsigned_short>
            (root,strings,n);
  traverse<vector_bagwell<unsigned_char*,16u>,void(*)(unsigned_char**,int,int),unsigned_short>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort_superalphabet_bagwell(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<32000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}